

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

double RESCALE(int NN,double *PT,double ETA,double INFIN,double SMALNO,double BASE)

{
  double dVar1;
  double dVar2;
  int local_84;
  int i;
  double L;
  double SC;
  double rescale;
  double X;
  double MIN;
  double MAX;
  double LO;
  double HI;
  double BASE_local;
  double SMALNO_local;
  double INFIN_local;
  double ETA_local;
  double *PT_local;
  double dStack_10;
  int NN_local;
  
  dVar1 = sqrt(INFIN);
  MIN = 0.0;
  X = INFIN;
  for (local_84 = 0; local_84 < NN; local_84 = local_84 + 1) {
    dVar2 = PT[local_84];
    if (MIN < dVar2) {
      MIN = dVar2;
    }
    if (((dVar2 != 0.0) || (NAN(dVar2))) && (dVar2 < X)) {
      X = dVar2;
    }
  }
  if ((X < SMALNO / ETA) || (dVar1 < MIN)) {
    L = (SMALNO / ETA) / X;
    if (1.0 < L) {
      if (MIN < INFIN / L) {
        L = 1.0;
      }
    }
    else {
      dVar1 = sqrt(MIN);
      dVar2 = sqrt(X);
      L = 1.0 / (dVar1 * dVar2);
    }
    dVar1 = log(L);
    dVar2 = log(BASE);
    dStack_10 = pow(BASE,dVar1 / dVar2 + 0.5);
  }
  else {
    dStack_10 = 1.0;
  }
  return dStack_10;
}

Assistant:

static double RESCALE(int NN, double *PT, double ETA, double INFIN, double SMALNO, double BASE) {
	/*
C RETURNS A SCALE FACTOR TO MULTIPLY THE COEFFICIENTS OF THE
C POLYNOMIAL. THE SCALING IS DONE TO AVOID OVERFLOW AND TO AVOID
C UNDETECTED UNDERFLOW INTERFERING WITH THE CONVERGENCE
C CRITERION.  THE FACTOR IS A POWER OF THE BASE.
C PT - MODULUS OF COEFFICIENTS OF P
C ETA,INFIN,SMALNO,BASE - CONSTANTS DESCRIBING THE
C FLOATING POINT ARITHMETIC.*/
	double HI, LO, MAX, MIN, X, rescale,SC,L;
	int i;

	HI = sqrt(INFIN);
	LO = SMALNO / ETA;
	MAX = 0.0;
	MIN = INFIN;

	for (i = 0; i < NN; ++i) {
		X = PT[i];
		if (X > MAX) {
			MAX = X;
		}

		if (X != 0.0 && X < MIN) {
			MIN = X;
		}
	}
	// C SCALE ONLY IF THERE ARE VERY LARGE OR VERY SMALL COMPONENTS.

	rescale = 1.0;

	if (MIN >= LO && MAX <= HI) {
		return rescale;
	}
	X = LO / MIN;
	if (X <= 1.0) {
		SC = 1.0 / (sqrt(MAX)*sqrt(MIN));
	}
	else {
		SC = X;

		if (INFIN / SC > MAX) {
			SC = 1.0;
		}
	}

	L = log(SC) / log(BASE) + .500;
	rescale = pow(BASE, L);
	return rescale;
}